

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O1

void __thiscall despot::NoisyLaserTag::Init(NoisyLaserTag *this)

{
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  vector<double,std::allocator<double>> *this_01;
  iterator __position;
  int iVar1;
  long lVar2;
  long lVar3;
  OBS_TYPE OVar4;
  double dVar5;
  double dVar6;
  ulong extraout_XMM0_Qb;
  double dVar7;
  double dVar8;
  double dVar9;
  double prob;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  
  lVar3 = (long)NBEAMS;
  if (0 < lVar3) {
    OVar4 = (this->super_BaseTag).same_loc_obs_;
    lVar2 = 0;
    do {
      OVar4 = 0x65L << ((byte)lVar2 & 0x3f) |
              ~(~(-1L << ((byte)BITS_PER_READING & 0x3f)) << ((byte)lVar2 & 0x3f)) & OVar4;
      lVar2 = lVar2 + BITS_PER_READING;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    (this->super_BaseTag).same_loc_obs_ = OVar4;
  }
  this_00 = &this->reading_distributions_;
  iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)iVar1);
  iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this_00->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar3,(long)NBEAMS);
      if (0 < NBEAMS) {
        lVar2 = 0;
        do {
          dVar5 = LaserRange(this,&(this->super_BaseTag).states_.
                                   super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar3]->super_State,
                             (int)lVar2);
          dVar9 = this->unit_size_;
          if (0.0 < dVar5 / dVar9) {
            local_58 = -dVar5;
            uStack_50 = extraout_XMM0_Qb ^ 0x8000000000000000;
            iVar1 = 1;
            dVar7 = 0.0;
            local_48 = dVar5;
            do {
              dVar8 = (double)iVar1;
              dVar5 = dVar9 * dVar8;
              if (local_48 <= dVar9 * dVar8) {
                dVar5 = local_48;
              }
              dVar5 = (double)despot::gausscdf(dVar5 - local_48,0.0,this->noise_sigma_);
              dVar6 = 0.0;
              if (iVar1 != 1) {
                dVar6 = (double)despot::gausscdf(dVar7 * dVar9 + local_58,0.0,this->noise_sigma_);
              }
              local_60 = (dVar5 - dVar6) + (dVar5 - dVar6);
              this_01 = (vector<double,std::allocator<double>> *)
                        (*(long *)&(this_00->
                                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar3].
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar2 * 0x18);
              __position._M_current = *(double **)(this_01 + 8);
              if (__position._M_current == *(double **)(this_01 + 0x10)) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (this_01,__position,&local_60);
              }
              else {
                *__position._M_current = local_60;
                *(double **)(this_01 + 8) = __position._M_current + 1;
              }
              dVar9 = this->unit_size_;
              iVar1 = iVar1 + 1;
              dVar7 = dVar8;
            } while (dVar8 < local_48 / dVar9);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < NBEAMS);
      }
      lVar3 = lVar3 + 1;
      iVar1 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void NoisyLaserTag::Init() {
	for (int i = 0; i < NBEAMS; i++)
		SetReading(same_loc_obs_, 101, i);

	reading_distributions_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		reading_distributions_[s].resize(NBEAMS);

		for (int d = 0; d < NBEAMS; d++) {
			double dist = LaserRange(*states_[s], d);
			for (int reading = 0; reading < dist / unit_size_; reading++) {
				double min_noise = reading * unit_size_ - dist;
				double max_noise = min(dist, (reading + 1) * unit_size_) - dist;
				double prob =
					2
						* (gausscdf(max_noise, 0, noise_sigma_)
							- (reading > 0 ?
								gausscdf(min_noise, 0, noise_sigma_) : 0 /*min_noise = -infty*/));

				reading_distributions_[s][d].push_back(prob);
			}
		}
	}
}